

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

Function * __thiscall
wasm::ModuleUtils::copyFunction(ModuleUtils *this,Function *func,Module *out,Name newName)

{
  bool bVar1;
  int iVar2;
  pointer pFVar3;
  undefined4 extraout_var;
  Function *pFVar4;
  ModuleUtils *local_48;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_30;
  __single_object ret;
  Module *out_local;
  Function *func_local;
  Name newName_local;
  
  newName_local.super_IString.str._M_len = newName.super_IString.str._M_len;
  ret._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)func;
  func_local = (Function *)out;
  std::make_unique<wasm::Function>();
  bVar1 = IString::is((IString *)&func_local);
  local_48 = this;
  if (bVar1) {
    local_48 = (ModuleUtils *)&func_local;
  }
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_30);
  Name::operator=((Name *)pFVar3,(Name *)local_48);
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_30);
  (pFVar3->type).id = *(uintptr_t *)(this + 0x38);
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_30);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator=
            (&pFVar3->vars,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)(this + 0x48));
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_30);
  std::
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  ::operator=(&pFVar3->localNames,
              (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
               *)(this + 0x70));
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_30);
  std::
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  ::operator=(&pFVar3->localIndices,
              (unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
               *)(this + 0xa8));
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_30);
  std::
  unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
  ::operator=(&pFVar3->debugLocations,
              (unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
               *)(this + 0xe0));
  iVar2 = ExpressionManipulator::copy
                    (*(EVP_PKEY_CTX **)(this + 0x60),
                     (EVP_PKEY_CTX *)
                     ret._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_30);
  pFVar3->body = (Expression *)CONCAT44(extraout_var,iVar2);
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_30);
  Name::operator=(&(pFVar3->super_Importable).module,(Name *)(this + 0x18));
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_30);
  Name::operator=(&(pFVar3->super_Importable).base,(Name *)(this + 0x28));
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(this + 0x68));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pFVar4 = (Function *)
             ::wasm::Module::addFunction
                       ((unique_ptr *)
                        ret._M_t.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_30);
    return pFVar4;
  }
  __assert_fail("!func->stackIR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/module-utils.h"
                ,0x2d,"Function *wasm::ModuleUtils::copyFunction(Function *, Module &, Name)");
}

Assistant:

inline Function*
copyFunction(Function* func, Module& out, Name newName = Name()) {
  auto ret = std::make_unique<Function>();
  ret->name = newName.is() ? newName : func->name;
  ret->type = func->type;
  ret->vars = func->vars;
  ret->localNames = func->localNames;
  ret->localIndices = func->localIndices;
  ret->debugLocations = func->debugLocations;
  ret->body = ExpressionManipulator::copy(func->body, out);
  ret->module = func->module;
  ret->base = func->base;
  // TODO: copy Stack IR
  assert(!func->stackIR);
  return out.addFunction(std::move(ret));
}